

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  char cVar2;
  int iVar3;
  string *psVar4;
  size_type sVar5;
  int iVar6;
  undefined8 uVar7;
  pointer pcVar8;
  int buffer_size;
  void *void_buffer;
  uint local_44;
  uint8_t *local_40;
  LogMessageFatal local_38 [16];
  
  psVar4 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                     (0,*(int *)&this->buffer_end_ - *(int *)&this->buffer_,"0 == BufferSize()");
  if (psVar4 != (string *)0x0) {
    pcVar8 = (psVar4->_M_dataplus)._M_p;
    sVar5 = psVar4->_M_string_length;
    uVar7 = 0x2a1;
LAB_002784c5:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,uVar7,sVar5,pcVar8);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    pZVar1 = this->input_;
    do {
      iVar3 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&local_40,&local_44);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        this->buffer_ = (uint8_t *)0x0;
        this->buffer_end_ = (uint8_t *)0x0;
        return false;
      }
    } while ((long)(int)local_44 == 0);
    this->buffer_ = local_40;
    this->buffer_end_ = local_40 + (int)local_44;
    psVar4 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_
                       (local_44,0,"buffer_size >= 0");
    if (psVar4 != (string *)0x0) {
      pcVar8 = (psVar4->_M_dataplus)._M_p;
      sVar5 = psVar4->_M_string_length;
      uVar7 = 0x2b6;
      goto LAB_002784c5;
    }
    iVar3 = this->total_bytes_read_;
    iVar6 = iVar3 - (local_44 ^ 0x7fffffff);
    if (iVar6 == 0 || iVar3 < (int)(local_44 ^ 0x7fffffff)) {
      iVar3 = local_44 + iVar3;
    }
    else {
      this->overflow_bytes_ = iVar6;
      this->buffer_end_ = this->buffer_end_ + -(long)iVar6;
      iVar3 = 0x7fffffff;
    }
    this->total_bytes_read_ = iVar3;
    RecomputeBufferLimits(this);
  }
  else {
    cVar2 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (cVar2 = '\0', this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar2 = '\0';
    }
  }
  return (bool)cVar2;
}

Assistant:

bool CodedInputStream::Refresh() {
  ABSL_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    ABSL_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}